

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O3

void __thiscall helics::apps::Clone::initialize(Clone *this)

{
  element_type *peVar1;
  value_type_conflict2 local_c;
  
  generateInterfaces(this);
  local_c = 0;
  CLI::std::vector<int,_std::allocator<int>_>::resize
            (&this->pubPointCount,(this->subids)._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_c);
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterInitializingMode
            ((Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]));
  captureForCurrentTime(this,(Time)0xffffffffc4653600,0);
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterExecutingMode
            ((Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
  captureForCurrentTime(this,(Time)0x0,0);
  return;
}

Assistant:

void Clone::initialize()
{
    generateInterfaces();

    pubPointCount.resize(subids.size(), 0);

    fed->enterInitializingMode();
    captureForCurrentTime(-1.0);

    fed->enterExecutingMode();
    captureForCurrentTime(0.0);
}